

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  bool bVar1;
  SPIRType *type;
  CompilerError *pCVar2;
  uint32_t r;
  uint uVar3;
  char (*in_R8) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string *ts_3;
  uint32_t r_1;
  uint uVar4;
  char **in_stack_fffffffffffffc58;
  uint local_384;
  SmallVector<unsigned_int,_8UL> *local_380;
  string bitcast_op;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  string template_expr;
  string base;
  SPIRType scalar_type;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  local_380 = composite_chain;
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant).field_0xc);
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id);
  bVar1 = Compiler::is_scalar((Compiler *)this,type);
  if (bVar1) {
    local_190._12_4_ = 0x15;
  }
  else {
    local_190._12_4_ = *(undefined4 *)&(type->super_IVariant).field_0xc;
  }
  local_190._32_8_ = local_190 + 0x38;
  local_190._8_4_ = 0;
  local_190._0_8_ = &PTR__SPIRType_0047ef28;
  local_190._20_4_ = 0;
  local_190._40_8_ = 0;
  local_190._48_8_ = 8;
  local_190._88_8_ = local_190 + 0x70;
  local_190._96_8_ = 0;
  local_190._104_8_ = 8;
  local_190._120_4_ = 0;
  local_190[0x7c] = false;
  local_190[0x7d] = false;
  local_190._128_4_ = 0;
  local_190._132_4_ = 0;
  local_190._136_4_ = 0;
  local_190._140_4_ = 0;
  local_190._16_4_ = UInt;
  local_190._152_8_ = local_190 + 0xb0;
  local_190._160_8_ = 0;
  local_190._168_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_68 = &p_Stack_38;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_6c.id = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = ImageFormatUnknown;
  local_88._20_4_ = AccessQualifierReadOnly;
  local_88._24_4_ = 0;
  local_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_190._24_4_ = type->vecsize;
  local_190._28_4_ = type->columns;
  local_190._144_4_ = local_190._16_4_;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (type->basetype != Struct) {
      if ((type->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar2,
                   "Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                  );
        __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar4 = (this->hlsl_options).shader_model;
      ::std::__cxx11::string::string((string *)&base,(string *)&chain->base);
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar1) {
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
      }
      template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
      template_expr._M_string_length = 0;
      template_expr.field_2._M_local_buf[0] = '\0';
      if (0x3d < uVar4) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&bitcast_op,this,type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)0x300f8d,(char (*) [2])&bitcast_op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x342c7f,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
        ::std::__cxx11::string::~string((string *)&scalar_type);
        ::std::__cxx11::string::~string((string *)&bitcast_op);
      }
      if (type->columns == 1) {
        if (chain->row_major_matrix == false) {
          switch(type->vecsize) {
          case 1:
            break;
          case 2:
            break;
          case 3:
            break;
          case 4:
            break;
          default:
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar2,"Unknown vector size.");
            __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          write_access_chain_value_abi_cxx11_((string *)&scalar_type,this,value,local_380,false);
          if (uVar4 < 0x3e) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (&bitcast_op,this,local_190,type);
            if (bitcast_op._M_string_length != 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_358,(spirv_cross *)&bitcast_op,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3457d9,(char (*) [2])&scalar_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3511f2,(char (*) [2])in_R9);
              ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
              ::std::__cxx11::string::~string((string *)&local_358);
            }
            ::std::__cxx11::string::~string((string *)&bitcast_op);
          }
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&base,(char (*) [2])0x2fcc03,
                     (char **)&stack0xfffffffffffffc58,&template_expr,(char (*) [2])0x3457d9,
                     &chain->dynamic_index,&chain->static_index,(char (*) [3])0x341bb2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scalar_type,(char (*) [3])0x35022f);
          ::std::__cxx11::string::~string((string *)&scalar_type);
        }
        else {
          if (0x3d < uVar4) {
            SPIRType::SPIRType(&scalar_type,type);
            scalar_type.vecsize = 1;
            scalar_type.columns = 1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_358,this,&scalar_type,0);
            join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                      (&bitcast_op,(spirv_cross *)0x300f8d,(char (*) [2])&local_358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x342c7f
                       ,in_R8);
            ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
            ::std::__cxx11::string::~string((string *)&bitcast_op);
            ::std::__cxx11::string::~string((string *)&local_358);
            SPIRType::~SPIRType(&scalar_type);
          }
          local_338 = &chain->dynamic_index;
          for (uVar3 = 0; uVar3 < type->vecsize; uVar3 = uVar3 + 1) {
            write_access_chain_value_abi_cxx11_((string *)&scalar_type,this,value,local_380,true);
            if (1 < type->vecsize) {
              ::std::__cxx11::string::append((char *)&scalar_type);
              CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar3);
              ::std::__cxx11::string::append((char *)&scalar_type);
            }
            CompilerGLSL::remove_duplicate_swizzle(&this->super_CompilerGLSL,(string *)&scalar_type)
            ;
            if (uVar4 < 0x3e) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                        (&bitcast_op,this,local_190,type);
              if (bitcast_op._M_string_length != 0) {
                join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                          (&local_358,(spirv_cross *)&bitcast_op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3457d9,(char (*) [2])&scalar_type,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3511f2,(char (*) [2])in_R9);
                ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
                ::std::__cxx11::string::~string((string *)&local_358);
              }
              ::std::__cxx11::string::~string((string *)&bitcast_op);
            }
            bitcast_op._M_dataplus._M_p._0_4_ = chain->matrix_stride * uVar3 + chain->static_index;
            in_R9 = local_338;
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                       (char (*) [2])0x3457d9,local_338,(uint *)&bitcast_op,(char (*) [3])0x341bb2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scalar_type,(char (*) [3])0x35022f);
            ::std::__cxx11::string::~string((string *)&scalar_type);
          }
        }
      }
      else if (chain->row_major_matrix == false) {
        switch(type->vecsize) {
        case 1:
          break;
        case 2:
          break;
        case 3:
          break;
        case 4:
          break;
        default:
          pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar2,"Unknown vector size.");
          __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (0x3d < uVar4) {
          SPIRType::SPIRType(&scalar_type,type);
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_358,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x300f8d,(char (*) [2])&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x342c7f,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          ::std::__cxx11::string::~string((string *)&bitcast_op);
          ::std::__cxx11::string::~string((string *)&local_358);
          SPIRType::~SPIRType(&scalar_type);
        }
        local_338 = &chain->dynamic_index;
        for (local_384 = 0; local_384 < type->columns; local_384 = local_384 + 1) {
          write_access_chain_value_abi_cxx11_(&bitcast_op,this,value,local_380,true);
          join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330702,
                     (char (*) [2])&local_384,(uint *)0x330607,(char (*) [2])in_R9);
          ::std::__cxx11::string::~string((string *)&bitcast_op);
          if (uVar4 < 0x3e) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (&bitcast_op,this,local_190,type);
            if (bitcast_op._M_string_length != 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_358,(spirv_cross *)&bitcast_op,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3457d9,(char (*) [2])&scalar_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3511f2,(char (*) [2])in_R9);
              ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
              ::std::__cxx11::string::~string((string *)&local_358);
            }
            ::std::__cxx11::string::~string((string *)&bitcast_op);
          }
          bitcast_op._M_dataplus._M_p._0_4_ = chain->matrix_stride * local_384 + chain->static_index
          ;
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3457d9;
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&base,(char (*) [2])0x2fcc03,
                     (char **)&stack0xfffffffffffffc58,&template_expr,(char (*) [2])0x3457d9,
                     local_338,(uint *)&bitcast_op,(char (*) [3])0x341bb2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scalar_type,(char (*) [3])0x35022f);
          ::std::__cxx11::string::~string((string *)&scalar_type);
        }
      }
      else {
        if (0x3d < uVar4) {
          SPIRType::SPIRType(&scalar_type,type);
          scalar_type.vecsize = 1;
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_358,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x300f8d,(char (*) [2])&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x342c7f,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          ::std::__cxx11::string::~string((string *)&bitcast_op);
          ::std::__cxx11::string::~string((string *)&local_358);
          SPIRType::~SPIRType(&scalar_type);
        }
        for (uVar4 = 0; uVar4 < type->vecsize; uVar4 = uVar4 + 1) {
          uVar3 = 0;
          while( true ) {
            in_stack_fffffffffffffc58 =
                 (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffc58 >> 0x20),uVar3);
            if (type->columns <= uVar3) break;
            write_access_chain_value_abi_cxx11_(&bitcast_op,this,value,local_380,true);
            local_358._M_dataplus._M_p =
                 CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar4);
            ts_3 = &local_358;
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],char_const*>
                      ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330702
                       ,(char (*) [2])&stack0xfffffffffffffc58,(uint *)0x351648,
                       (char (*) [3])&local_358,in_stack_fffffffffffffc58);
            ::std::__cxx11::string::~string((string *)&bitcast_op);
            CompilerGLSL::remove_duplicate_swizzle(&this->super_CompilerGLSL,(string *)&scalar_type)
            ;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (&bitcast_op,this,local_190,type);
            if (bitcast_op._M_string_length != 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_358,(spirv_cross *)&bitcast_op,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3457d9,(char (*) [2])&scalar_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3511f2,(char (*) [2])ts_3);
              ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_358);
              ::std::__cxx11::string::~string((string *)&local_358);
            }
            local_358._M_dataplus._M_p._0_4_ =
                 chain->matrix_stride * uVar4 +
                 (type->width >> 3) * (int)in_stack_fffffffffffffc58 + chain->static_index;
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                       (char (*) [2])0x3457d9,&chain->dynamic_index,(uint *)&local_358,
                       (char (*) [3])0x341bb2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scalar_type,(char (*) [3])0x35022f);
            ::std::__cxx11::string::~string((string *)&bitcast_op);
            ::std::__cxx11::string::~string((string *)&scalar_type);
            uVar3 = (int)in_stack_fffffffffffffc58 + 1;
          }
        }
      }
      Compiler::register_write((Compiler *)this,(chain->super_IVariant).self.id);
      ::std::__cxx11::string::~string((string *)&template_expr);
      ::std::__cxx11::string::~string((string *)&base);
      goto LAB_001b9809;
    }
    write_access_chain_struct(this,chain,value,local_380);
  }
  else {
    write_access_chain_array(this,chain,value,local_380);
  }
  Compiler::register_write((Compiler *)this,(chain->super_IVariant).self.id);
LAB_001b9809:
  SPIRType::~SPIRType((SPIRType *)local_190);
  return;
}

Assistant:

void CompilerHLSL::write_access_chain(const SPIRAccessChain &chain, uint32_t value,
                                      const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Make sure we trigger a read of the constituents in the access chain.
	track_expression_read(chain.self);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		write_access_chain_array(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		write_access_chain_struct(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_store = hlsl_options.shader_model >= 62;

	auto base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	string template_expr;
	if (templated_store)
		template_expr = join("<", type_to_glsl(type), ">");

	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		auto store_expr = write_access_chain_value(value, composite_chain, false);

		if (!templated_store)
		{
			auto bitcast_op = bitcast_glsl_op(target_type, type);
			if (!bitcast_op.empty())
				store_expr = join(bitcast_op, "(", store_expr, ")");
		}
		else
			store_op = "Store";
		statement(base, ".", store_op, template_expr, "(", chain.dynamic_index, chain.static_index, ", ",
		          store_expr, ");");
	}
	else if (type.columns == 1)
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		// Strided store.
		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			auto store_expr = write_access_chain_value(value, composite_chain, true);
			if (type.vecsize > 1)
			{
				store_expr += ".";
				store_expr += index_to_swizzle(r);
			}
			remove_duplicate_swizzle(store_expr);

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".Store", template_expr, "(", chain.dynamic_index,
			          chain.static_index + chain.matrix_stride * r, ", ", store_expr, ");");
		}
	}
	else if (!chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_store)
		{
			store_op = "Store";
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
		}

		for (uint32_t c = 0; c < type.columns; c++)
		{
			auto store_expr = join(write_access_chain_value(value, composite_chain, true), "[", c, "]");

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".", store_op, template_expr, "(", chain.dynamic_index,
			          chain.static_index + c * chain.matrix_stride, ", ", store_expr, ");");
		}
	}
	else
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			for (uint32_t c = 0; c < type.columns; c++)
			{
				auto store_expr =
				    join(write_access_chain_value(value, composite_chain, true), "[", c, "].", index_to_swizzle(r));
				remove_duplicate_swizzle(store_expr);
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
				statement(base, ".Store", template_expr, "(", chain.dynamic_index,
				          chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ", ", store_expr, ");");
			}
		}
	}

	register_write(chain.self);
}